

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# weight_constraint.cpp
# Opt level: O3

void __thiscall Clasp::WeightConstraint::destroy(WeightConstraint *this,Solver *s,bool detach)

{
  ulong in_RAX;
  WL *pWVar1;
  WL WVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  undefined8 local_38;
  
  local_38 = in_RAX;
  if (s == (Solver *)0x0 || !detach) {
    uVar6 = *(uint *)&this->field_0x10;
  }
  else {
    pWVar1 = this->lits_;
    WVar2 = *pWVar1;
    if (((uint)WVar2 & 0x3fffffff) != 0) {
      uVar6 = 0;
      do {
        local_38._4_4_ = this->lits_[(ulong)(uVar6 << (SUB41(*this->lits_,3) >> 7)) + 1];
        Solver::removeWatch(s,(Literal *)((long)&local_38 + 4),&this->super_Constraint);
        local_38 = CONCAT44(local_38._4_4_,
                            this->lits_[(ulong)(uVar6 << (SUB41(*this->lits_,3) >> 7)) + 1]) &
                   0xfffffffffffffffe ^ 2;
        Solver::removeWatch(s,(Literal *)&local_38,&this->super_Constraint);
        uVar6 = uVar6 + 1;
      } while (((uint)WVar2 & 0x3fffffff) != uVar6);
      pWVar1 = this->lits_;
      WVar2 = *pWVar1;
    }
    uVar6 = *(uint *)&this->field_0x10;
    uVar5 = uVar6 & 0x7ffffff;
    uVar3 = (uint)WVar2 >> 0x1f;
    if (uVar5 != uVar3) {
      uVar4 = 0;
      do {
        uVar3 = *(uint *)((long)(s->assign_).assign_.ebo_.buf +
                         (ulong)((uint)pWVar1[(ulong)(((uint)this->bound_[(long)(int)uVar5 + 1] >> 2
                                                      ) << (sbyte)uVar3) + 1] & 0xfffffffc));
        if (uVar3 < 0x10) break;
        uVar3 = uVar3 >> 4;
        if (uVar3 != uVar4) {
          Solver::removeUndoWatch(s,uVar3,&this->super_Constraint);
          uVar6 = *(uint *)&this->field_0x10;
          pWVar1 = this->lits_;
          uVar4 = uVar3;
        }
        uVar5 = uVar6 - 1 & 0x7ffffff;
        uVar6 = uVar6 & 0xf8000000 | uVar5;
        *(uint *)&this->field_0x10 = uVar6;
        uVar3 = (uint)*pWVar1 >> 0x1f;
      } while (uVar5 != uVar3);
    }
  }
  if ((uVar6 >> 0x1b & 1) == 0) {
    WL::release(this->lits_);
  }
  (*(this->super_Constraint)._vptr_Constraint[0x10])(this);
  operator_delete(this);
  return;
}

Assistant:

void WeightConstraint::destroy(Solver* s, bool detach) {
	if (s && detach) {
		for (uint32 i = 0, end = size(); i != end; ++i) {
			s->removeWatch( lits_->lit(i), this );
			s->removeWatch(~lits_->lit(i), this );
		}
		for (uint32 last = 0, dl; (dl = highestUndoLevel(*s)) != 0; --up_) {
			if (dl != last) { s->removeUndoWatch(last = dl, this); }
		}
	}
	if (ownsLit_ == 0) { lits_->release(); }
	void* mem = static_cast<Constraint*>(this);
	this->~WeightConstraint();
	::operator delete(mem);
}